

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseSimdV128Const
          (WastParser *this,Const *const_,TokenType token_type,ConstType const_type)

{
  bool bVar1;
  Enum EVar2;
  Result RVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  uint64_t value;
  Location loc;
  Token token;
  undefined1 local_158 [84];
  uint local_104;
  ulong local_100;
  char *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  char *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  size_type sStack_b0;
  size_t local_a8;
  undefined8 uStack_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  Token local_78;
  
  bVar1 = true;
  switch(token_type) {
  case I8X16:
    uVar6 = 0x10;
    break;
  case I16X8:
    uVar6 = 8;
    break;
  case I32X4:
    uVar6 = 4;
    break;
  case I64X2:
    uVar6 = 2;
    break;
  case F32X4:
    uVar6 = 4;
    goto LAB_0016cb6f;
  case F64X2:
    uVar6 = 2;
LAB_0016cb6f:
    bVar1 = false;
    break;
  default:
    local_b8 = (const_->loc).filename.data_;
    sStack_b0 = (const_->loc).filename.size_;
    local_a8 = (const_->loc).field_1.field_1.offset;
    uStack_a0 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
    pcVar5 = GetTokenTypeName(token_type);
    Error(this,0x199f30,pcVar5);
    return (Result)Error;
  }
  Consume((Token *)local_158,this);
  GetToken((Token *)local_158,this);
  local_78.loc.filename.data_ = (char *)local_158._0_8_;
  (const_->loc).field_1.field_1.offset = CONCAT44(local_158._20_4_,local_158._16_4_);
  *(ulong *)((long)&(const_->loc).field_1 + 8) = CONCAT44(local_158._28_4_,local_158._24_4_);
  (const_->loc).filename.data_ = (char *)local_158._0_8_;
  (const_->loc).filename.size_ = CONCAT44(local_158._12_4_,local_158._8_4_);
  local_104 = uVar6 - 2 >> 1;
  local_100 = (ulong)local_104;
  uVar7 = 0;
  do {
    GetToken((Token *)local_158,this);
    uStack_d0 = CONCAT44(local_158._12_4_,local_158._8_4_);
    local_c8 = CONCAT44(local_158._20_4_,local_158._16_4_);
    uStack_c0 = CONCAT44(local_158._28_4_,local_158._24_4_);
    local_d8 = (char *)local_158._0_8_;
    GetToken(&local_78,this);
    uVar4 = (ulong)local_78.token_type_;
    if (0x31 < uVar4) {
LAB_0016cf43:
      if (!bVar1) {
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"a Float literal","");
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                   (string *)local_158,local_158 + 0x20);
        pcVar5 = "42.0";
        goto LAB_0016cfa2;
      }
LAB_0016cf4e:
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"a Nat or Integer literal","");
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                 (string *)local_158,local_158 + 0x20);
      pcVar5 = "123";
LAB_0016cfa2:
      RVar3 = ErrorExpected(this,&local_98,pcVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_);
        return (Result)RVar3.enum_;
      }
      return (Result)RVar3.enum_;
    }
    if ((0x800018000000U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x3000000000000U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_0016cf43;
      if (!bVar1) goto LAB_0016cce7;
      Consume((Token *)local_158,this);
      if (2 < local_158._32_4_ - First_Literal) {
        __assert_fail("HasLiteral()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                      ,0x6a,"const Literal &wabt::Token::literal() const");
      }
      RVar3.enum_ = Ok;
      if (local_104 < 8) {
        EVar2 = (*(code *)(&DAT_00199938 + *(int *)(&DAT_00199938 + local_100 * 4)))
                          (local_158._48_8_,
                           (char *)(local_158._48_8_ + CONCAT44(local_158._60_4_,local_158._56_4_)))
        ;
        return (Result)EVar2;
      }
    }
    else {
      if (bVar1) goto LAB_0016cf4e;
LAB_0016cce7:
      local_158._16_4_ = 0;
      local_158._20_4_ = 0;
      local_158._24_4_ = 0;
      local_158._0_8_ = (char *)0x0;
      local_158._8_4_ = 0;
      local_158._12_4_ = 0;
      local_158._32_4_ = ~First;
      RVar3.enum_ = Ok;
      local_158._40_4_ = Int;
      local_158._56_4_ = None;
      if ((ulong)uVar6 == 2) {
        RVar3 = ParseF64(this,(Const *)local_158,const_type);
        (const_->lane_type_).enum_ = F64;
        Const::From<unsigned_long>
                  (const_,(Type)0xfffffffb,CONCAT44(local_158._44_4_,local_158._40_4_),(int)uVar7);
joined_r0x0016ce26:
        if (uVar7 < 4) {
          const_->nan_[uVar7] = None;
        }
      }
      else if (uVar6 == 4) {
        RVar3 = ParseF32(this,(Const *)local_158,const_type);
        (const_->lane_type_).enum_ = F32;
        Const::From<unsigned_int>(const_,(Type)0xfffffffb,local_158._40_4_,(int)uVar7);
        goto joined_r0x0016ce26;
      }
      if (uVar7 < 4) {
        const_->nan_[uVar7] = local_158._56_4_;
      }
    }
    if (RVar3.enum_ == Error) {
      local_e8 = local_c8;
      uStack_e0 = uStack_c0;
      local_f8 = local_d8;
      uStack_f0 = uStack_d0;
      Token::to_string_abi_cxx11_((string *)local_158,&local_78);
      Error(this,0x199fd0,(char *)local_158._0_8_);
      if ((undefined1 *)local_158._0_8_ == local_158 + 0x10) {
        return (Result)Error;
      }
      operator_delete((void *)local_158._0_8_);
      return (Result)Error;
    }
    uVar7 = uVar7 + 1;
    if (uVar6 == uVar7) {
      return (Result)Ok;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseSimdV128Const(Const* const_,
                                      TokenType token_type,
                                      ConstType const_type) {
  WABT_TRACE(ParseSimdV128Const);

  uint8_t lane_count = 0;
  bool integer = true;
  switch (token_type) {
    case TokenType::I8X16: { lane_count = 16; break; }
    case TokenType::I16X8: { lane_count = 8; break; }
    case TokenType::I32X4: { lane_count = 4; break; }
    case TokenType::I64X2: { lane_count = 2; break; }
    case TokenType::F32X4: { lane_count = 4; integer = false; break; }
    case TokenType::F64X2: { lane_count = 2; integer = false; break; }
    default: {
      Error(
        const_->loc,
        "Unexpected type at start of simd constant. "
        "Expected one of: i8x16, i16x8, i32x4, i64x2, f32x4, f64x2. "
        "Found \"%s\".",
        GetTokenTypeName(token_type)
      );
      return Result::Error;
    }
  }
  Consume();

  const_->loc = GetLocation();

  for (int lane = 0; lane < lane_count; ++lane) {
    Location loc = GetLocation();

    // Check that the lane literal type matches the element type of the v128:
    Token token = GetToken();
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
        // OK.
        break;

      case TokenType::Float:
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        if (integer) {
          goto error;
        }
        break;

      error:
      default:
        if (integer) {
          return ErrorExpected({"a Nat or Integer literal"}, "123");
        } else {
          return ErrorExpected({"a Float literal"}, "42.0");
        }
    }

    Result result;

    // For each type, parse the next literal, bound check it, and write it to
    // the array of bytes:
    if (integer) {
      string_view sv = Consume().literal().text;
      const char* s = sv.begin();
      const char* end = sv.end();

      switch (lane_count) {
        case 16: {
          uint8_t value = 0;
          result = ParseInt8(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u8(lane, value);
          break;
        }
        case 8: {
          uint16_t value = 0;
          result = ParseInt16(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u16(lane, value);
          break;
        }
        case 4: {
          uint32_t value = 0;
          result = ParseInt32(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u32(lane, value);
          break;
        }
        case 2: {
          uint64_t value = 0;
          result = ParseInt64(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u64(lane, value);
          break;
        }
      }
    } else {
      Const lane_const_;
      switch (lane_count) {
        case 4:
          result = ParseF32(&lane_const_, const_type);
          const_->set_v128_f32(lane, lane_const_.f32_bits());
          break;

        case 2:
          result = ParseF64(&lane_const_, const_type);
          const_->set_v128_f64(lane, lane_const_.f64_bits());
          break;
      }

      const_->set_expected_nan(lane, lane_const_.expected_nan());
    }

    if (Failed(result)) {
      Error(loc, "invalid literal \"%s\"", token.to_string().c_str());
      return Result::Error;
    }
  }

  return Result::Ok;
}